

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astArgumentNode_create
          (sysbvm_context_t *context,sysbvm_tuple_t sourcePosition,sysbvm_tuple_t isForAll,
          sysbvm_tuple_t name,sysbvm_tuple_t type)

{
  sysbvm_object_tuple_t *psVar1;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).astArgumentNodeType,7);
  (psVar1->field_1).pointers[0] = sourcePosition;
  psVar1[1].field_1.pointers[0] = isForAll;
  psVar1[2].header.field_0.typePointer = name;
  psVar1[2].header.identityHashAndFlags = (int)type;
  psVar1[2].header.objectSize = (int)(type >> 0x20);
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_astArgumentNode_create(sysbvm_context_t *context, sysbvm_tuple_t sourcePosition, sysbvm_tuple_t isForAll, sysbvm_tuple_t name, sysbvm_tuple_t type)
{
    sysbvm_astArgumentNode_t *result = (sysbvm_astArgumentNode_t*)sysbvm_context_allocatePointerTuple(context, context->roots.astArgumentNodeType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_astArgumentNode_t));
    result->super.sourcePosition = sourcePosition;
    result->isForAll = isForAll;
    result->name = name;
    result->type = type;
    return (sysbvm_tuple_t)result;
}